

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O1

void __thiscall FParseContext::AddSym(FParseContext *this,char *sym,int val)

{
  uint *puVar1;
  long lVar2;
  int *piVar3;
  FParseSymbol *pFVar4;
  byte bVar5;
  FParseSymbol syme;
  int local_64;
  char local_60 [79];
  undefined1 local_11;
  
  bVar5 = 0;
  local_64 = val;
  strncpy(local_60,sym,0x4f);
  local_11 = 0;
  TArray<FParseSymbol,_FParseSymbol>::Grow(&this->symbols,1);
  piVar3 = &local_64;
  pFVar4 = (this->symbols).Array + (this->symbols).Count;
  for (lVar2 = 0x15; lVar2 != 0; lVar2 = lVar2 + -1) {
    pFVar4->Value = *piVar3;
    piVar3 = piVar3 + (ulong)bVar5 * -2 + 1;
    pFVar4 = (FParseSymbol *)((long)pFVar4 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  puVar1 = &(this->symbols).Count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void FParseContext::AddSym (char *sym, int val)
{
	FParseSymbol syme;
	syme.Value = val;
	strncpy (syme.Sym, sym, 79);
	syme.Sym[79]=0;
	symbols.Push(syme);
}